

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bounds.cpp
# Opt level: O0

void __thiscall libDAI::BoundTree::display(BoundTree *this,ostream *os,FactorGraph *fg)

{
  long *plVar1;
  bool bVar2;
  ostream *poVar3;
  Var *this_00;
  long lVar4;
  BoundTreeNode *pBVar5;
  long *in_RDX;
  ostream *in_RSI;
  BoundTreeNode *in_RDI;
  pre_order_iterator pVar6;
  iterator node_2;
  iterator node_1;
  iterator node;
  tree_node *in_stack_fffffffffffffe58;
  tree_node *in_stack_fffffffffffffea8;
  iterator_base local_128;
  tree_node *local_118;
  undefined1 local_110;
  pre_order_iterator local_108;
  tree_node *local_f8;
  undefined1 local_f0;
  pre_order_iterator local_e8;
  tree_node *local_d8;
  undefined1 local_d0;
  iterator_base local_c8;
  tree_node *local_b8;
  undefined1 local_b0;
  tree_node *local_a8;
  undefined1 local_a0;
  pre_order_iterator local_98;
  tree_node *local_88;
  undefined1 local_80;
  iterator_base local_78;
  tree_node *local_68;
  undefined1 local_60;
  tree_node *local_58;
  undefined1 local_50;
  pre_order_iterator local_48;
  tree_node *local_38;
  undefined1 local_30;
  iterator_base local_28;
  long *local_18;
  ostream *local_10;
  
  local_18 = in_RDX;
  local_10 = in_RSI;
  poVar3 = std::operator<<(in_RSI,"digraph G {");
  std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
  poVar3 = std::operator<<(local_10,"node[shape=circle,width=0.4,fixedsize=true];");
  std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
  pVar6 = tree<libDAI::BoundTreeNode,_std::allocator<tree_node_<libDAI::BoundTreeNode>_>_>::begin
                    ((tree<libDAI::BoundTreeNode,_std::allocator<tree_node_<libDAI::BoundTreeNode>_>_>
                      *)0xb0eea3);
  local_38 = pVar6.super_iterator_base.node;
  local_30 = pVar6.super_iterator_base.skip_current_children_;
  local_28.node = local_38;
  local_28.skip_current_children_ = (bool)local_30;
  while( true ) {
    pVar6 = tree<libDAI::BoundTreeNode,_std::allocator<tree_node_<libDAI::BoundTreeNode>_>_>::end
                      ((tree<libDAI::BoundTreeNode,_std::allocator<tree_node_<libDAI::BoundTreeNode>_>_>
                        *)0xb0eede);
    local_58 = pVar6.super_iterator_base.node;
    local_50 = pVar6.super_iterator_base.skip_current_children_;
    local_48.super_iterator_base.node = local_58;
    local_48.super_iterator_base.skip_current_children_ = (bool)local_50;
    bVar2 = tree<libDAI::BoundTreeNode,_std::allocator<tree_node_<libDAI::BoundTreeNode>_>_>::
            pre_order_iterator::operator!=((pre_order_iterator *)&local_28,&local_48);
    if (!bVar2) break;
    pBVar5 = tree<libDAI::BoundTreeNode,_std::allocator<tree_node_<libDAI::BoundTreeNode>_>_>::
             iterator_base::operator->(&local_28);
    if (pBVar5->_type == VAR) {
      std::operator<<(local_10,"\t");
      tree<libDAI::BoundTreeNode,_std::allocator<tree_node_<libDAI::BoundTreeNode>_>_>::
      iterator_base::operator*(&local_28);
      poVar3 = libDAI::operator<<((ostream *)in_stack_fffffffffffffea8,in_RDI);
      poVar3 = std::operator<<(poVar3,"[label=v");
      plVar1 = local_18;
      pBVar5 = tree<libDAI::BoundTreeNode,_std::allocator<tree_node_<libDAI::BoundTreeNode>_>_>::
               iterator_base::operator->(&local_28);
      this_00 = (Var *)(**(code **)(*plVar1 + 0x30))(plVar1,pBVar5->_index);
      lVar4 = Var::label(this_00);
      std::ostream::operator<<(poVar3,lVar4);
      pBVar5 = tree<libDAI::BoundTreeNode,_std::allocator<tree_node_<libDAI::BoundTreeNode>_>_>::
               iterator_base::operator->(&local_28);
      if ((pBVar5->_forcedleaf & 1U) == 0) {
        poVar3 = std::operator<<(local_10,"];");
        std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
      }
      else {
        poVar3 = std::operator<<(local_10,",color=gray,style=filled];");
        std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
      }
    }
    pVar6 = tree<libDAI::BoundTreeNode,_std::allocator<tree_node_<libDAI::BoundTreeNode>_>_>::
            pre_order_iterator::operator++((pre_order_iterator *)in_stack_fffffffffffffe58,0);
    local_68 = pVar6.super_iterator_base.node;
    local_60 = pVar6.super_iterator_base.skip_current_children_;
  }
  poVar3 = std::operator<<(local_10,"node[shape=box,width=0.3,height=0.3,fixedsize=true];");
  std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
  pVar6 = tree<libDAI::BoundTreeNode,_std::allocator<tree_node_<libDAI::BoundTreeNode>_>_>::begin
                    ((tree<libDAI::BoundTreeNode,_std::allocator<tree_node_<libDAI::BoundTreeNode>_>_>
                      *)0xb0f078);
  local_88 = pVar6.super_iterator_base.node;
  local_80 = pVar6.super_iterator_base.skip_current_children_;
  local_78.node = local_88;
  local_78.skip_current_children_ = (bool)local_80;
  while( true ) {
    pVar6 = tree<libDAI::BoundTreeNode,_std::allocator<tree_node_<libDAI::BoundTreeNode>_>_>::end
                      ((tree<libDAI::BoundTreeNode,_std::allocator<tree_node_<libDAI::BoundTreeNode>_>_>
                        *)0xb0f0b3);
    local_a8 = pVar6.super_iterator_base.node;
    local_a0 = pVar6.super_iterator_base.skip_current_children_;
    local_98.super_iterator_base.node = local_a8;
    local_98.super_iterator_base.skip_current_children_ = (bool)local_a0;
    bVar2 = tree<libDAI::BoundTreeNode,_std::allocator<tree_node_<libDAI::BoundTreeNode>_>_>::
            pre_order_iterator::operator!=((pre_order_iterator *)&local_78,&local_98);
    if (!bVar2) break;
    pBVar5 = tree<libDAI::BoundTreeNode,_std::allocator<tree_node_<libDAI::BoundTreeNode>_>_>::
             iterator_base::operator->(&local_78);
    if (pBVar5->_type == FACTOR) {
      std::operator<<(local_10,"\t");
      tree<libDAI::BoundTreeNode,_std::allocator<tree_node_<libDAI::BoundTreeNode>_>_>::
      iterator_base::operator*(&local_78);
      poVar3 = libDAI::operator<<((ostream *)in_stack_fffffffffffffea8,in_RDI);
      poVar3 = std::operator<<(poVar3,"[label=f");
      pBVar5 = tree<libDAI::BoundTreeNode,_std::allocator<tree_node_<libDAI::BoundTreeNode>_>_>::
               iterator_base::operator->(&local_78);
      std::ostream::operator<<(poVar3,pBVar5->_index);
      pBVar5 = tree<libDAI::BoundTreeNode,_std::allocator<tree_node_<libDAI::BoundTreeNode>_>_>::
               iterator_base::operator->(&local_78);
      if ((pBVar5->_forcedleaf & 1U) == 0) {
        poVar3 = std::operator<<(local_10,"];");
        std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
      }
      else {
        poVar3 = std::operator<<(local_10,",color=gray,style=filled];");
        std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
      }
    }
    pVar6 = tree<libDAI::BoundTreeNode,_std::allocator<tree_node_<libDAI::BoundTreeNode>_>_>::
            pre_order_iterator::operator++((pre_order_iterator *)in_stack_fffffffffffffe58,0);
    local_b8 = pVar6.super_iterator_base.node;
    local_b0 = pVar6.super_iterator_base.skip_current_children_;
  }
  poVar3 = std::operator<<(local_10,"edge[color=black];");
  std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
  pVar6 = tree<libDAI::BoundTreeNode,_std::allocator<tree_node_<libDAI::BoundTreeNode>_>_>::begin
                    ((tree<libDAI::BoundTreeNode,_std::allocator<tree_node_<libDAI::BoundTreeNode>_>_>
                      *)0xb0f22a);
  local_d8 = pVar6.super_iterator_base.node;
  local_d0 = pVar6.super_iterator_base.skip_current_children_;
  local_c8.node = local_d8;
  local_c8.skip_current_children_ = (bool)local_d0;
  while( true ) {
    pVar6 = tree<libDAI::BoundTreeNode,_std::allocator<tree_node_<libDAI::BoundTreeNode>_>_>::end
                      ((tree<libDAI::BoundTreeNode,_std::allocator<tree_node_<libDAI::BoundTreeNode>_>_>
                        *)0xb0f265);
    local_f8 = pVar6.super_iterator_base.node;
    local_f0 = pVar6.super_iterator_base.skip_current_children_;
    local_e8.super_iterator_base.node = local_f8;
    local_e8.super_iterator_base.skip_current_children_ = (bool)local_f0;
    bVar2 = tree<libDAI::BoundTreeNode,_std::allocator<tree_node_<libDAI::BoundTreeNode>_>_>::
            pre_order_iterator::operator!=((pre_order_iterator *)&local_c8,&local_e8);
    if (!bVar2) break;
    pVar6 = tree<libDAI::BoundTreeNode,_std::allocator<tree_node_<libDAI::BoundTreeNode>_>_>::begin
                      ((tree<libDAI::BoundTreeNode,_std::allocator<tree_node_<libDAI::BoundTreeNode>_>_>
                        *)0xb0f2be);
    local_118 = pVar6.super_iterator_base.node;
    local_110 = pVar6.super_iterator_base.skip_current_children_;
    local_108.super_iterator_base.node = local_118;
    local_108.super_iterator_base.skip_current_children_ = (bool)local_110;
    bVar2 = tree<libDAI::BoundTreeNode,_std::allocator<tree_node_<libDAI::BoundTreeNode>_>_>::
            pre_order_iterator::operator!=((pre_order_iterator *)&local_c8,&local_108);
    if (bVar2) {
      poVar3 = std::operator<<(local_10,"\t");
      pVar6.super_iterator_base._8_8_ = poVar3;
      pVar6.super_iterator_base.node = in_stack_fffffffffffffe58;
      pVar6 = tree<libDAI::BoundTreeNode,std::allocator<tree_node_<libDAI::BoundTreeNode>>>::
              parent<tree<libDAI::BoundTreeNode,std::allocator<tree_node_<libDAI::BoundTreeNode>>>::pre_order_iterator>
                        (pVar6);
      local_128.node = pVar6.super_iterator_base.node;
      local_128.skip_current_children_ = pVar6.super_iterator_base.skip_current_children_;
      tree<libDAI::BoundTreeNode,_std::allocator<tree_node_<libDAI::BoundTreeNode>_>_>::
      iterator_base::operator*(&local_128);
      poVar3 = libDAI::operator<<((ostream *)in_stack_fffffffffffffea8,in_RDI);
      std::operator<<(poVar3," -> ");
      tree<libDAI::BoundTreeNode,_std::allocator<tree_node_<libDAI::BoundTreeNode>_>_>::
      iterator_base::operator*(&local_c8);
      poVar3 = libDAI::operator<<((ostream *)in_stack_fffffffffffffea8,in_RDI);
      std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
    }
    pVar6 = tree<libDAI::BoundTreeNode,_std::allocator<tree_node_<libDAI::BoundTreeNode>_>_>::
            pre_order_iterator::operator++((pre_order_iterator *)in_stack_fffffffffffffe58,0);
    in_stack_fffffffffffffea8 = pVar6.super_iterator_base.node;
  }
  poVar3 = std::operator<<(local_10,"}");
  std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
  return;
}

Assistant:

void BoundTree::display( std::ostream & os, const FactorGraph &fg ) {
//        if( true ) {
        os << "digraph G {" << endl;

        // variables
        os << "node[shape=circle,width=0.4,fixedsize=true];" << endl;
        for( tree<BoundTreeNode>::iterator node = tr.begin(); node != tr.end(); node++ )
            if( node->_type == BoundTreeNode::VAR ) {
                os << "\t" << (*node) << "[label=v" << fg.var(node->_index).label();
                if( node->_forcedleaf )
                    os << ",color=gray,style=filled];" << endl;
                else
                    os << "];" << endl;
            }

        //factors 
        os << "node[shape=box,width=0.3,height=0.3,fixedsize=true];" << endl;
        for( tree<BoundTreeNode>::iterator node = tr.begin(); node != tr.end(); node++ )
            if( node->_type == BoundTreeNode::FACTOR ) {
                os << "\t" << (*node) << "[label=f" << node->_index;
                if( node->_forcedleaf )
                    os << ",color=gray,style=filled];" << endl;
                else
                    os << "];" << endl;
            }

        // edges
        os << "edge[color=black];" << endl;
        for( tree<BoundTreeNode>::iterator node = tr.begin(); node != tr.end(); node++ )
            if( node != tr.begin() )
                os << "\t" << (*tr.parent(node)) << " -> " << (*node) << endl;

        os << "}" << endl;
/*        } else {
            os << "graph G {" << endl;

            // variables
            os << "node[shape=circle,width=0.4,fixedsize=true,color=lightgray];" << endl;
            for( size_t j = 0; j < fg.nrVars(); j++ ) {
                os << "\tv" << fg.var(j).label();
                tree<BoundTreeNode>::iterator node = find( BoundTreeNode::VAR, j );
                if( node == tr.begin() )
                    os << "[color=blue,style=filled];" << endl;
                else if( node != tr.end() ) {
                    if( node->_forcedleaf )
                        os << "[color=blue,style=filled];" << endl;
                    else
                        os << "[color=blue];" << endl;
                } else
                    os << ";" << endl;
            }

            //factors 
            os << "node[shape=box,width=0.3,height=0.3,fixedsize=true,color=lightgray];" << endl;
            for( size_t I = 0; I < fg.nrFactors(); I++ ) {
                os << "\tf" << I;
                tree<BoundTreeNode>::iterator node = find( BoundTreeNode::FACTOR, I );
                if( node != tr.end() ) {
                    if( node->_forcedleaf )
                        os << "[color=blue,style=filled];" << endl;
                    else
                        os << "[color=blue];" << endl;
                } else
                    os << ";" << endl;
            }

            // edges
            os << "edge[color=lightgray];" << endl;
            for( size_t e = 0; e < fg.nrEdges(); e++ ) {
                size_t i = fg.edge(e).first;
                size_t I = fg.edge(e).second;
                if( containsEdge( i, I ) )
                    os << "\tv" << fg.var(i).label() << " -- f" << I << "[color=blue];" << endl;
                else
                    os << "\tv" << fg.var(i).label() << " -- f" << I << ";" << endl;
            }
            os << "}" << endl;
        }*/
    }